

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O2

size_t xemmai::t_type_of<xemmai::t_tuple>::f_do_greater_equal(t_object *a_this,t_pvalue *a_stack)

{
  int iVar1;
  
  f_check<xemmai::t_tuple>(a_stack[2].super_t_pointer.v_p,L"argument0");
  iVar1 = t_tuple::f_compare((t_tuple *)a_this->v_data,
                             (t_tuple *)(a_stack[2].super_t_pointer.v_p)->v_data);
  (a_stack->super_t_pointer).v_p = (t_object *)((ulong)(-1 < iVar1) + 1);
  return 0xffffffffffffffff;
}

Assistant:

size_t t_type_of<t_tuple>::f_do_greater_equal(t_object* a_this, t_pvalue* a_stack)
{
	f_check<t_tuple>(a_stack[2], L"argument0");
	a_stack[0] = a_this->f_as<t_tuple>().f_compare(a_stack[2]->f_as<t_tuple>()) >= 0;
	return -1;
}